

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2polyline_layer.cc
# Opt level: O1

void __thiscall
s2builderutil::S2PolylineLayer::Init
          (S2PolylineLayer *this,S2Polyline *polyline,LabelSetIds *label_set_ids,
          IdSetLexicon *label_set_lexicon,Options *options)

{
  bool bVar1;
  S2LogMessage SStack_18;
  
  if ((label_set_ids == (LabelSetIds *)0x0) != (label_set_lexicon == (IdSetLexicon *)0x0)) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_s2polyline_layer.cc"
               ,0x34,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,
               "Check failed: (label_set_ids == nullptr) == (label_set_lexicon == nullptr) ",0x4b);
    abort();
  }
  this->polyline_ = polyline;
  this->label_set_ids_ = label_set_ids;
  this->label_set_lexicon_ = label_set_lexicon;
  (this->options_).edge_type_ = options->edge_type_;
  bVar1 = options->validate_;
  (this->options_).validate_ = bVar1;
  if ((bVar1 & 1U) != 0) {
    S2Polyline::set_s2debug_override(polyline,DISABLE);
    return;
  }
  return;
}

Assistant:

void S2PolylineLayer::Init(S2Polyline* polyline, LabelSetIds* label_set_ids,
                           IdSetLexicon* label_set_lexicon,
                           const Options& options) {
  S2_DCHECK_EQ(label_set_ids == nullptr, label_set_lexicon == nullptr);
  polyline_ = polyline;
  label_set_ids_ = label_set_ids;
  label_set_lexicon_ = label_set_lexicon;
  options_ = options;

  if (options_.validate()) {
    polyline_->set_s2debug_override(S2Debug::DISABLE);
  }
}